

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ContainerUtilities.h
# Opt level: O2

bool soul::
     removeItem<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>,soul::heart::Function&>
               (ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,_32UL> *v,
               Function *itemToRemove)

{
  size_t sVar1;
  pool_ref<soul::heart::Function> *ppVar2;
  pool_ref<soul::heart::Function> *startElement;
  
  startElement = std::
                 __find_if<soul::pool_ref<soul::heart::Function>*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Function_const>>
                           (v->items,v->items + v->numActive,itemToRemove);
  sVar1 = v->numActive;
  ppVar2 = v->items;
  if (startElement != ppVar2 + sVar1) {
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,_32UL>::erase(v,startElement);
  }
  return startElement != ppVar2 + sVar1;
}

Assistant:

inline bool removeItem (Vector& v, ItemType&& itemToRemove)
{
    auto found = std::find (std::begin (v), std::end (v), itemToRemove);

    if (found == std::end (v))
        return false;

    v.erase (found);
    return true;
}